

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnWriter::CompressPage
          (ColumnWriter *this,MemoryStream *temp_writer,size_t *compressed_size,
          data_ptr_t *compressed_data,AllocatedData *compressed_buf)

{
  void *dst;
  int iVar1;
  data_ptr_t pdVar2;
  void *src;
  size_t srcSize;
  Allocator *pAVar3;
  uchar *puVar4;
  char *src_00;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  uint8_t *input_buffer;
  unsigned_long params;
  InternalException *pIVar9;
  MiniZStream s;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  mz_ulong mStack_a0;
  char *local_98;
  mz_internal_state *pmStack_90;
  mz_alloc_func local_88;
  mz_free_func p_Stack_80;
  void *local_78;
  undefined8 uStack_70;
  mz_ulong local_68;
  mz_ulong mStack_60;
  MiniZStreamType local_58;
  AllocatedData local_48 [24];
  
  switch(this->writer->codec) {
  case UNCOMPRESSED:
    sVar5 = duckdb::MemoryStream::GetPosition();
    *compressed_size = sVar5;
    pdVar2 = (data_ptr_t)duckdb::MemoryStream::GetData();
    goto LAB_002493da;
  case SNAPPY:
    sVar5 = duckdb::MemoryStream::GetPosition();
    sVar5 = duckdb_snappy::MaxCompressedLength(sVar5);
    *compressed_size = sVar5;
    pAVar3 = (Allocator *)duckdb::BufferAllocator::Get(this->writer->context);
    uVar6 = *compressed_size;
    puVar4 = (uchar *)duckdb::Allocator::AllocateData((ulong)pAVar3);
    duckdb::AllocatedData::AllocatedData((AllocatedData *)local_c8,pAVar3,puVar4,uVar6);
    duckdb::AllocatedData::operator=(compressed_buf,(AllocatedData *)local_c8);
    duckdb::AllocatedData::~AllocatedData((AllocatedData *)local_c8);
    pcVar8 = (char *)duckdb::MemoryStream::GetData();
    sVar5 = duckdb::MemoryStream::GetPosition();
    duckdb_snappy::RawCompress(pcVar8,sVar5,*(char **)(compressed_buf + 8),compressed_size);
    break;
  case GZIP:
    local_68 = 0;
    mStack_60 = 0;
    local_78 = (void *)0x0;
    uStack_70._0_4_ = 0;
    uStack_70._4_4_ = 0;
    local_88 = (mz_alloc_func)0x0;
    p_Stack_80 = (mz_free_func)0x0;
    local_98 = (char *)0x0;
    pmStack_90 = (mz_internal_state *)0x0;
    local_a8._0_4_ = 0;
    local_a8._4_4_ = 0;
    mStack_a0 = 0;
    local_c8._16_8_ = 0;
    local_c8._24_8_ = (uchar *)0x0;
    local_c8._0_8_ = (uchar *)0x0;
    local_c8._8_8_ = 0;
    local_58 = MINIZ_TYPE_NONE;
    uVar6 = duckdb::MemoryStream::GetPosition();
    lVar7 = duckdb_miniz::mz_compressBound(uVar6);
    *compressed_size = lVar7 + 0x12;
    pAVar3 = (Allocator *)duckdb::BufferAllocator::Get(this->writer->context);
    uVar6 = *compressed_size;
    puVar4 = (uchar *)duckdb::Allocator::AllocateData((ulong)pAVar3);
    duckdb::AllocatedData::AllocatedData(local_48,pAVar3,puVar4,uVar6);
    duckdb::AllocatedData::operator=(compressed_buf,local_48);
    duckdb::AllocatedData::~AllocatedData(local_48);
    pcVar8 = (char *)duckdb::MemoryStream::GetData();
    sVar5 = duckdb::MemoryStream::GetPosition();
    MiniZStream::Compress
              ((MiniZStream *)local_c8,pcVar8,sVar5,*(char **)(compressed_buf + 8),compressed_size);
    *compressed_data = *(data_ptr_t *)(compressed_buf + 8);
    MiniZStream::~MiniZStream((MiniZStream *)local_c8);
    goto LAB_002493e2;
  default:
    pIVar9 = (InternalException *)__cxa_allocate_exception(0x10);
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"Unsupported codec for Parquet Writer","");
    duckdb::InternalException::InternalException(pIVar9,(string *)local_c8);
    __cxa_throw(pIVar9,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  case BROTLI:
    sVar5 = duckdb::MemoryStream::GetPosition();
    sVar5 = duckdb_brotli::BrotliEncoderMaxCompressedSize(sVar5);
    *compressed_size = sVar5;
    pAVar3 = (Allocator *)duckdb::BufferAllocator::Get(this->writer->context);
    uVar6 = *compressed_size;
    puVar4 = (uchar *)duckdb::Allocator::AllocateData((ulong)pAVar3);
    duckdb::AllocatedData::AllocatedData((AllocatedData *)local_c8,pAVar3,puVar4,uVar6);
    duckdb::AllocatedData::operator=(compressed_buf,(AllocatedData *)local_c8);
    duckdb::AllocatedData::~AllocatedData((AllocatedData *)local_c8);
    sVar5 = duckdb::MemoryStream::GetPosition();
    input_buffer = (uint8_t *)duckdb::MemoryStream::GetData();
    duckdb_brotli::BrotliEncoderCompress
              (0xb,0x16,BROTLI_MODE_GENERIC,sVar5,input_buffer,compressed_size,
               *(uint8_t **)(compressed_buf + 8));
    break;
  case ZSTD:
    sVar5 = duckdb::MemoryStream::GetPosition();
    sVar5 = duckdb_zstd::ZSTD_compressBound(sVar5);
    *compressed_size = sVar5;
    pAVar3 = (Allocator *)duckdb::BufferAllocator::Get(this->writer->context);
    uVar6 = *compressed_size;
    puVar4 = (uchar *)duckdb::Allocator::AllocateData((ulong)pAVar3);
    duckdb::AllocatedData::AllocatedData((AllocatedData *)local_c8,pAVar3,puVar4,uVar6);
    duckdb::AllocatedData::operator=(compressed_buf,(AllocatedData *)local_c8);
    duckdb::AllocatedData::~AllocatedData((AllocatedData *)local_c8);
    dst = *(void **)(compressed_buf + 8);
    sVar5 = *compressed_size;
    src = (void *)duckdb::MemoryStream::GetData();
    srcSize = duckdb::MemoryStream::GetPosition();
    sVar5 = duckdb_zstd::ZSTD_compress(dst,sVar5,src,srcSize,(int)this->writer->compression_level);
    goto LAB_00249258;
  case LZ4_RAW:
    iVar1 = duckdb::MemoryStream::GetPosition();
    iVar1 = duckdb_lz4::LZ4_compressBound(iVar1);
    *compressed_size = (long)iVar1;
    pAVar3 = (Allocator *)duckdb::BufferAllocator::Get(this->writer->context);
    uVar6 = *compressed_size;
    puVar4 = (uchar *)duckdb::Allocator::AllocateData((ulong)pAVar3);
    duckdb::AllocatedData::AllocatedData((AllocatedData *)local_c8,pAVar3,puVar4,uVar6);
    duckdb::AllocatedData::operator=(compressed_buf,(AllocatedData *)local_c8);
    duckdb::AllocatedData::~AllocatedData((AllocatedData *)local_c8);
    src_00 = (char *)duckdb::MemoryStream::GetData();
    pcVar8 = *(char **)(compressed_buf + 8);
    iVar1 = duckdb::MemoryStream::GetPosition();
    iVar1 = duckdb_lz4::LZ4_compress_default(src_00,pcVar8,iVar1,(int)*compressed_size);
    sVar5 = (size_t)iVar1;
LAB_00249258:
    *compressed_size = sVar5;
  }
  pdVar2 = *(data_ptr_t *)(compressed_buf + 8);
LAB_002493da:
  *compressed_data = pdVar2;
LAB_002493e2:
  if (*compressed_size >> 0x1f == 0) {
    return;
  }
  pIVar9 = (InternalException *)__cxa_allocate_exception(0x10);
  local_c8._0_8_ = local_c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,
             "Parquet writer: %d compressed page size out of range for type integer","");
  params = duckdb::MemoryStream::GetPosition();
  InternalException::InternalException<unsigned_long>(pIVar9,(string *)local_c8,params);
  __cxa_throw(pIVar9,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ColumnWriter::CompressPage(MemoryStream &temp_writer, size_t &compressed_size, data_ptr_t &compressed_data,
                                AllocatedData &compressed_buf) {
	switch (writer.GetCodec()) {
	case CompressionCodec::UNCOMPRESSED:
		compressed_size = temp_writer.GetPosition();
		compressed_data = temp_writer.GetData();
		break;

	case CompressionCodec::SNAPPY: {
		compressed_size = duckdb_snappy::MaxCompressedLength(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		duckdb_snappy::RawCompress(const_char_ptr_cast(temp_writer.GetData()), temp_writer.GetPosition(),
		                           char_ptr_cast(compressed_buf.get()), &compressed_size);
		compressed_data = compressed_buf.get();
		D_ASSERT(compressed_size <= duckdb_snappy::MaxCompressedLength(temp_writer.GetPosition()));
		break;
	}
	case CompressionCodec::LZ4_RAW: {
		compressed_size = duckdb_lz4::LZ4_compressBound(UnsafeNumericCast<int32_t>(temp_writer.GetPosition()));
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		compressed_size = duckdb_lz4::LZ4_compress_default(
		    const_char_ptr_cast(temp_writer.GetData()), char_ptr_cast(compressed_buf.get()),
		    UnsafeNumericCast<int32_t>(temp_writer.GetPosition()), UnsafeNumericCast<int32_t>(compressed_size));
		compressed_data = compressed_buf.get();
		break;
	}
	case CompressionCodec::GZIP: {
		MiniZStream s;
		compressed_size = s.MaxCompressedLength(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		s.Compress(const_char_ptr_cast(temp_writer.GetData()), temp_writer.GetPosition(),
		           char_ptr_cast(compressed_buf.get()), &compressed_size);
		compressed_data = compressed_buf.get();
		break;
	}
	case CompressionCodec::ZSTD: {
		compressed_size = duckdb_zstd::ZSTD_compressBound(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		compressed_size = duckdb_zstd::ZSTD_compress((void *)compressed_buf.get(), compressed_size,
		                                             (const void *)temp_writer.GetData(), temp_writer.GetPosition(),
		                                             UnsafeNumericCast<int32_t>(writer.CompressionLevel()));
		compressed_data = compressed_buf.get();
		break;
	}
	case CompressionCodec::BROTLI: {
		compressed_size = duckdb_brotli::BrotliEncoderMaxCompressedSize(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		duckdb_brotli::BrotliEncoderCompress(BROTLI_DEFAULT_QUALITY, BROTLI_DEFAULT_WINDOW, BROTLI_DEFAULT_MODE,
		                                     temp_writer.GetPosition(), temp_writer.GetData(), &compressed_size,
		                                     compressed_buf.get());
		compressed_data = compressed_buf.get();
		break;
	}
	default:
		throw InternalException("Unsupported codec for Parquet Writer");
	}

	if (compressed_size > idx_t(NumericLimits<int32_t>::Maximum())) {
		throw InternalException("Parquet writer: %d compressed page size out of range for type integer",
		                        temp_writer.GetPosition());
	}
}